

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall
QDir::mkpath(QDir *this,QString *dirPath,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dirPath->d).size == 0) {
    local_50.m_filePath.d.d._0_4_ = 2;
    local_50.m_filePath.d.size._4_4_ = 0;
    local_50.m_filePath.d._4_8_ = 0;
    local_50.m_filePath.d._12_8_ = 0;
    local_50.m_nativeFilePath.d.d = (Data *)0x455595;
    uVar3 = 0;
    QMessageLogger::warning((QMessageLogger *)&local_50,"QDir::mkpath: Empty or null file name");
  }
  else {
    pQVar1 = (this->d_ptr).d.ptr;
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    filePath((QString *)&local_68,this,dirPath);
    _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (pQVar1->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      QFileSystemEntry::QFileSystemEntry(&local_50,(QString *)&local_68);
      uVar3 = QFileSystemEngine::mkpath(&local_50,permissions);
      QFileSystemEntry::~QFileSystemEntry(&local_50);
    }
    else {
      uVar3 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0x78))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         &local_68,1,
                         permissions.
                         super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                         _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::mkpath(const QString &dirPath, std::optional<QFile::Permissions> permissions) const
{
    Q_D(const QDir);

    if (dirPath.isEmpty()) {
        qWarning("QDir::mkpath: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirPath);
    if (!d->fileEngine)
        return QFileSystemEngine::mkpath(QFileSystemEntry(fn), permissions);
    return d->fileEngine->mkdir(fn, true, permissions);
}